

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_functions.hpp
# Opt level: O0

void test_quadrature<WeightedPolynomial<ChebyshevT3WeightFunction>,IntegratorXX::GaussChebyshev3<double,double>,std::vector<double,std::allocator<double>>&>
               (string *msg,GaussChebyshev3<double,_double> *quad,double ref,double e,
               vector<double,_std::allocator<double>_> *args)

{
  double dVar1;
  ulong uVar2;
  size_t sVar3;
  const_reference pvVar4;
  WithinAbsMatcher *matcher;
  double dVar5;
  string local_188;
  WithinAbsMatcher local_168;
  MatchExpr<double_&,_IntegratorXX::Matchers::WithinAbsMatcher> local_110;
  StringRef local_f0;
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  AssertionHandler catchAssertionHandler;
  vector<double,_std::allocator<double>_> local_68;
  int local_4c;
  double dStack_48;
  int i;
  double res;
  weight_container *wgt;
  point_container *pts;
  vector<double,_std::allocator<double>_> *args_local;
  double e_local;
  double ref_local;
  GaussChebyshev3<double,_double> *quad_local;
  string *msg_local;
  
  pts = args;
  args_local = (vector<double,_std::allocator<double>_> *)e;
  e_local = ref;
  ref_local = (double)quad;
  quad_local = (GaussChebyshev3<double,_double> *)msg;
  wgt = IntegratorXX::
        QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
        ::points((QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                  *)quad);
  res = (double)IntegratorXX::
                QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                ::weights((QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                           *)ref_local);
  dStack_48 = 0.0;
  local_4c = 0;
  while( true ) {
    uVar2 = (ulong)local_4c;
    sVar3 = IntegratorXX::
            QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
            ::npts((QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                    *)ref_local);
    if (sVar3 <= uVar2) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)res,(long)local_4c);
    dVar1 = *pvVar4;
    std::vector<double,_std::allocator<double>_>::vector(&local_68,pts);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](wgt,(long)local_4c);
    dVar5 = WeightedPolynomial<ChebyshevT3WeightFunction>::evaluate(&local_68,*pvVar4);
    dStack_48 = dVar1 * dVar5 + dStack_48;
    std::vector<double,_std::allocator<double>_>::~vector(&local_68);
    local_4c = local_4c + 1;
  }
  local_e0._16_16_ = (undefined1  [16])operator____catch_sr("REQUIRE_THAT",0xc);
  matcher = (WithinAbsMatcher *)local_e0;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)matcher,
             "/workspace/llm4binary/github/license_all_cmakelists_25/wavefunction91[P]IntegratorXX/test/test_functions.hpp"
             ,0x79);
  local_f0 = operator____catch_sr("res, IntegratorXX::Matchers::WithinAbs(msg, ref, e)",0x33);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_c0,(StringRef)local_e0._16_16_,(SourceLineInfo *)matcher,
             local_f0,Normal);
  std::__cxx11::string::string((string *)&local_188,(string *)msg);
  IntegratorXX::Matchers::WithinAbs(&local_168,&local_188,e_local,(double)args_local);
  Catch::makeMatchExpr<double&,IntegratorXX::Matchers::WithinAbsMatcher>
            (&local_110,(Catch *)&stack0xffffffffffffffb8,(double *)&local_168,matcher);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_c0,&local_110.super_ITransientExpression);
  Catch::MatchExpr<double_&,_IntegratorXX::Matchers::WithinAbsMatcher>::~MatchExpr(&local_110);
  IntegratorXX::Matchers::WithinAbsMatcher::~WithinAbsMatcher(&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  Catch::AssertionHandler::complete((AssertionHandler *)local_c0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_c0);
  return;
}

Assistant:

void test_quadrature(std::string msg, const QuadType& quad, double ref, double e, PreArgs&&... args) {
  const auto& pts = quad.points();
  const auto& wgt = quad.weights();

  double res = 0.0;
  for(auto i = 0; i < quad.npts(); ++i) {
    res += wgt[i] * TestFunction::evaluate(args..., pts[i]);
  }
  
  //standard_matcher(mes, res, ref, e);
  //printf("diff = %.6e\n", std::abs(ref - res));
  REQUIRE_THAT(res, IntegratorXX::Matchers::WithinAbs(msg, ref, e));
}